

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

InstanceSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::InstanceSymbol,char_const(&)[1],slang::SourceLocation_const&,slang::ast::InstanceBodySymbol&>
          (BumpAllocator *this,char (*args) [1],SourceLocation *args_1,InstanceBodySymbol *args_2)

{
  SourceLocation SVar1;
  size_t sVar2;
  InstanceSymbol *pIVar3;
  
  pIVar3 = (InstanceSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((InstanceSymbol *)this->endPtr < pIVar3 + 1) {
    pIVar3 = (InstanceSymbol *)allocateSlow(this,0x80,8);
  }
  else {
    this->head->current = (byte *)(pIVar3 + 1);
  }
  sVar2 = strlen(*args);
  SVar1 = *args_1;
  (pIVar3->super_InstanceSymbolBase).super_Symbol.kind = Instance;
  (pIVar3->super_InstanceSymbolBase).super_Symbol.name._M_len = sVar2;
  (pIVar3->super_InstanceSymbolBase).super_Symbol.name._M_str = *args;
  (pIVar3->super_InstanceSymbolBase).super_Symbol.location = SVar1;
  (pIVar3->super_InstanceSymbolBase).super_Symbol.parentScope = (Scope *)0x0;
  (pIVar3->super_InstanceSymbolBase).super_Symbol.nextInScope = (Symbol *)0x0;
  (pIVar3->super_InstanceSymbolBase).super_Symbol.indexInScope = 0;
  (pIVar3->super_InstanceSymbolBase).arrayPath._M_extent._M_extent_value = 0;
  (pIVar3->super_InstanceSymbolBase).super_Symbol.originatingSyntax = (SyntaxNode *)0x0;
  (pIVar3->super_InstanceSymbolBase).arrayPath._M_ptr = (pointer)0x0;
  pIVar3->body = args_2;
  pIVar3->canonicalBody = (InstanceBodySymbol *)0x0;
  (pIVar3->connections)._M_ptr = (pointer)0x0;
  (pIVar3->connections)._M_extent._M_extent_value = 0;
  pIVar3->resolvedConfig = (ResolvedConfig *)0x0;
  pIVar3->connectionMap = (PointerMap *)0x0;
  args_2->parentInstance = pIVar3;
  return pIVar3;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }